

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.hpp
# Opt level: O2

void __thiscall Centaurus::ChaserEM64T<wchar_t>::~ChaserEM64T(ChaserEM64T<wchar_t> *this)

{
  ~ChaserEM64T(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~ChaserEM64T() {}